

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTransformNode(XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  runtime_error *this_00;
  size_t sVar4;
  _func_int **pp_Var5;
  element_type *peVar6;
  __atomic_base<unsigned_long> _Var7;
  long *in_RDX;
  Node *in_RDI;
  TransformNode *node;
  size_t i_2;
  Ref<embree::SceneGraph::GroupNode> group;
  TransformNode *node_1;
  AffineSpace3ff space_1;
  size_t i_1;
  size_t j;
  avector<AffineSpace3ff> spaces;
  AffineSpace3ff space;
  bool quaternion;
  string str_time_steps;
  int time_steps;
  size_t i_4;
  size_t i_3;
  size_t i;
  Ref<embree::XML> *in_stack_000010d8;
  XMLLoader *in_stack_000010e0;
  size_t *in_stack_fffffffffffff7d8;
  string *in_stack_fffffffffffff7e0;
  undefined1 *puVar8;
  GroupNode *in_stack_fffffffffffff7e8;
  size_t in_stack_fffffffffffff7f8;
  GroupNode *in_stack_fffffffffffff800;
  string *in_stack_fffffffffffff820;
  XML *in_stack_fffffffffffff828;
  TransformNode *in_stack_fffffffffffff830;
  ParseLocation *in_stack_fffffffffffff888;
  int local_6dc;
  element_type *local_6a0;
  _func_int **local_698;
  undefined1 local_690 [120];
  size_t local_618;
  pointer pRStack_610;
  pointer local_608;
  pointer pRStack_600;
  pointer local_5f8;
  pointer pTStack_5f0;
  pointer local_5e8;
  size_t sStack_5e0;
  size_t local_5d8;
  pointer pRStack_5d0;
  size_t local_5c8;
  size_t sStack_5c0;
  size_t local_5b8;
  size_t sStack_5b0;
  size_t local_5a8;
  size_t sStack_5a0;
  size_t local_598;
  pointer pRStack_590;
  size_t local_588;
  size_t sStack_580;
  size_t local_578;
  size_t sStack_570;
  size_t local_568;
  size_t sStack_560;
  size_t local_558;
  pointer pRStack_550;
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  ulong local_518;
  long local_510;
  undefined1 local_508 [8];
  ulong local_500;
  ulong local_4f8;
  void *local_4f0;
  undefined1 local_4e8 [16];
  undefined1 auStack_4d8 [16];
  undefined1 auStack_4c8 [16];
  undefined1 auStack_4b8 [27];
  byte local_49d;
  allocator local_489;
  string local_488 [32];
  string local_468 [36];
  int local_444;
  long *local_440;
  long *local_428;
  long *local_420;
  long *local_418;
  long *local_410;
  long *local_408;
  long *local_400;
  const_reference local_3f8;
  long *local_3f0;
  long *local_3e8;
  const_reference local_3e0;
  long *local_3d8;
  size_t *local_3c8;
  size_t *local_3c0;
  size_t *local_3b8;
  size_t *local_3b0;
  size_t *local_3a8;
  size_t *local_3a0;
  size_t *local_398;
  size_t *local_390;
  size_t *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  size_t *local_370;
  pointer *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  size_t *local_350;
  size_t *local_348;
  size_t *local_340;
  size_t *local_338;
  size_t *local_330;
  undefined1 *local_328;
  long local_318;
  undefined1 *local_310;
  long local_308;
  undefined1 *local_300;
  _func_int **local_2f8;
  _func_int **local_2e8;
  undefined1 *local_2d8;
  XML *local_2c8;
  element_type **local_2b8;
  element_type *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  element_type **local_288;
  element_type *local_280;
  element_type **local_278;
  undefined1 *local_270;
  int local_260;
  undefined4 local_25c;
  undefined1 *local_258;
  size_t *local_250;
  ulong local_248;
  undefined1 *local_240;
  size_t *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  size_t *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  size_t *local_1e8;
  size_t *local_1e0;
  size_t *local_1d8;
  undefined1 *local_1d0;
  size_t *local_1c8;
  undefined1 *local_1c0;
  size_t *local_1b8;
  size_t *local_1b0;
  size_t *local_1a8;
  size_t *local_1a0;
  undefined1 *local_198;
  size_t *local_190;
  undefined1 *local_188;
  size_t *local_180;
  size_t *local_178;
  size_t *local_170;
  size_t *local_168;
  size_t *local_160;
  pointer *local_158;
  undefined1 *local_150;
  pointer *local_148;
  undefined1 *local_140;
  size_t *local_138;
  size_t *local_130;
  size_t *local_128;
  size_t *local_120;
  undefined1 *local_118;
  size_t *local_110;
  undefined1 *local_108;
  size_t *local_100;
  size_t *local_f8;
  size_t *local_f0;
  size_t *local_e8;
  size_t *local_e0;
  size_t *local_d8;
  size_t *local_d0;
  size_t *local_c8;
  size_t *local_c0;
  size_t *local_b8;
  size_t *local_b0;
  Ref<embree::XML> *in_stack_ffffffffffffff68;
  XMLLoader *in_stack_ffffffffffffff70;
  ulong local_58;
  
  local_444 = 1;
  local_440 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_488,"time_steps",&local_489);
  XML::parm(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator((allocator<char> *)&local_489);
  bVar2 = std::operator!=(in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8);
  if (bVar2) {
    local_260 = std::__cxx11::stoi(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,0);
    local_25c = 1;
    local_6dc = local_260;
    if (local_260 < 2) {
      local_6dc = 1;
    }
    local_444 = local_6dc;
  }
  local_49d = 0;
  local_258 = local_4e8;
  local_220 = auStack_4d8;
  local_228 = auStack_4c8;
  local_1f0 = auStack_4b8;
  uVar3 = (ulong)local_444;
  local_240 = local_508;
  local_500 = 0;
  local_4f8 = 0;
  local_4f0 = (void *)0x0;
  local_248 = uVar3;
  local_230 = local_258;
  local_218 = local_258;
  if (uVar3 != 0) {
    local_4f0 = alignedMalloc((size_t)in_stack_fffffffffffff7e8,(size_t)in_stack_fffffffffffff7e0);
    for (local_58 = 0; local_4f8 = uVar3, local_58 < uVar3; local_58 = local_58 + 1) {
    }
  }
  local_510 = 0;
  local_518 = 0;
  local_500 = local_4f8;
  do {
    if ((ulong)(long)local_444 <= local_518) {
      local_410 = local_440;
      sVar4 = XML::size((XML *)0x3a821d);
      if (sVar4 == (long)(local_444 + 1)) {
        pp_Var5 = (_func_int **)SceneGraph::TransformNode::operator_new(0x3a824f);
        local_690[0x1f] = 1;
        local_418 = local_440;
        std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
        operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                   (*local_440 + 0x80),(long)local_444);
        loadNode(in_stack_000010e0,in_stack_000010d8);
        SceneGraph::TransformNode::TransformNode
                  (in_stack_fffffffffffff830,(avector<AffineSpace3ff> *)in_stack_fffffffffffff828,
                   (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff820);
        local_690[0x1f] = 0;
        local_2d8 = local_690 + 0x20;
        if ((long *)local_690._32_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_690._32_8_ + 0x18))();
        }
        *(byte *)(pp_Var5 + 0x12) = local_49d & 1;
        (in_RDI->super_RefCount)._vptr_RefCount = pp_Var5;
        local_690._40_8_ = pp_Var5;
        local_2f8 = pp_Var5;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
        local_690._24_4_ = 1;
      }
      else {
        peVar6 = (element_type *)::operator_new(0x80);
        SceneGraph::GroupNode::GroupNode(in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
        local_2a0 = local_690 + 0x10;
        local_2a8 = peVar6;
        local_690._16_8_ = peVar6;
        if (peVar6 != (element_type *)0x0) {
          (**(code **)(*(long *)peVar6 + 0x10))();
        }
        local_690._8_8_ = SEXT48(local_444);
        while( true ) {
          uVar1 = local_690._8_8_;
          local_420 = local_440;
          _Var7._M_i = XML::size((XML *)0x3a8510);
          if (_Var7._M_i <= (ulong)uVar1) break;
          local_298 = local_690 + 0x10;
          local_428 = local_440;
          in_stack_fffffffffffff830 = (TransformNode *)*local_440;
          std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
          operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *
                     )&(in_stack_fffffffffffff830->spaces).spaces.size_alloced,local_690._8_8_);
          loadNode(in_stack_000010e0,in_stack_000010d8);
          SceneGraph::GroupNode::add
                    (in_stack_fffffffffffff7e8,
                     (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff7e0);
          in_stack_fffffffffffff828 = (XML *)local_690;
          local_2c8 = in_stack_fffffffffffff828;
          if ((_func_int **)local_690._0_8_ != (_func_int **)0x0) {
            (**(code **)(*(_func_int **)local_690._0_8_ + 0x18))();
          }
          local_690._8_8_ = local_690._8_8_ + 1;
        }
        pp_Var5 = (_func_int **)SceneGraph::TransformNode::operator_new(0x3a86ab);
        local_288 = &local_6a0;
        local_290 = local_690 + 0x10;
        local_280 = (element_type *)local_690._16_8_;
        local_278 = &local_6a0;
        local_6a0 = (element_type *)local_690._16_8_;
        if ((element_type *)local_690._16_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_690._16_8_ + 0x10))();
        }
        SceneGraph::TransformNode::TransformNode
                  (in_stack_fffffffffffff830,(avector<AffineSpace3ff> *)in_stack_fffffffffffff828,
                   (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff820);
        local_2b8 = &local_6a0;
        if (local_6a0 != (element_type *)0x0) {
          (**(code **)(*(long *)local_6a0 + 0x18))();
        }
        *(byte *)(pp_Var5 + 0x12) = local_49d & 1;
        (in_RDI->super_RefCount)._vptr_RefCount = pp_Var5;
        local_698 = pp_Var5;
        local_2e8 = pp_Var5;
        if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
          (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
        }
        local_690._24_4_ = 1;
        local_270 = local_690 + 0x10;
        if ((element_type *)local_690._16_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_690._16_8_ + 0x18))();
        }
      }
      puVar8 = local_508;
      for (uVar3 = 0; uVar3 < local_500; uVar3 = uVar3 + 1) {
      }
      local_328 = puVar8;
      alignedFree(in_stack_fffffffffffff7d8);
      *(undefined8 *)(puVar8 + 0x18) = 0;
      *(undefined8 *)(puVar8 + 0x10) = 0;
      *(undefined8 *)(puVar8 + 8) = 0;
      std::__cxx11::string::~string(local_468);
      return (Ref<embree::SceneGraph::Node>)in_RDI;
    }
    local_250 = &local_558;
    local_208 = local_548;
    local_210 = local_538;
    local_1f8 = local_528;
    local_3d8 = local_440;
    local_238 = local_250;
    local_200 = local_250;
    local_3e0 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
                operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            *)(*local_440 + 0x80),local_518);
    bVar2 = std::operator==(in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8);
    if (bVar2) {
      local_3e8 = local_440;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (*local_440 + 0x80),local_518);
      load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
                ((XMLLoader *)group.ptr,(Ref<embree::XML> *)i_2);
      local_340 = &local_598;
      local_348 = &local_5d8;
      local_598 = local_5d8;
      pRStack_590 = pRStack_5d0;
      local_c0 = &local_588;
      local_c8 = &local_5c8;
      local_d0 = &local_578;
      local_d8 = &local_5b8;
      local_e0 = &local_568;
      local_e8 = &local_5a8;
      local_390 = &local_558;
      local_398 = &local_598;
      local_558 = local_5d8;
      pRStack_550 = pRStack_5d0;
      local_1c8 = &local_588;
      local_1c0 = local_548;
      local_1d8 = &local_578;
      local_1d0 = local_538;
      local_388 = &local_568;
      local_380 = local_528;
      local_300 = local_508;
      local_308 = local_510;
      local_3a0 = (size_t *)((long)local_4f0 + local_510 * 0x40);
      local_3a8 = &local_558;
      *local_3a0 = local_5d8;
      local_3a0[1] = (size_t)pRStack_5d0;
      local_188 = local_548;
      local_180 = local_3a0 + 2;
      *local_180 = local_588;
      local_3a0[3] = sStack_580;
      local_198 = local_538;
      local_190 = local_3a0 + 4;
      *local_190 = local_578;
      local_3a0[5] = sStack_570;
      local_378 = local_528;
      local_370 = local_3a0 + 6;
      *local_370 = local_568;
      local_3a0[7] = sStack_560;
      local_338 = local_348;
      local_330 = local_340;
      local_1e8 = local_398;
      local_1e0 = local_390;
      local_1b8 = local_398;
      local_1b0 = local_390;
      local_1a8 = local_3a8;
      local_1a0 = local_3a0;
      local_178 = local_3a8;
      local_170 = local_3a0;
      local_b8 = local_348;
      local_b0 = local_340;
      local_588 = local_5c8;
      sStack_580 = sStack_5c0;
      local_578 = local_5b8;
      sStack_570 = sStack_5b0;
      local_568 = local_5a8;
      sStack_560 = sStack_5a0;
    }
    else {
      local_3f0 = local_440;
      local_3f8 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                  ::operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                                *)(*local_440 + 0x80),local_518);
      bVar2 = std::operator==(in_stack_fffffffffffff7e0,(char *)in_stack_fffffffffffff7d8);
      if (!bVar2) {
        local_690[0x37] = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_408 = local_440;
        ParseLocation::str_abi_cxx11_(in_stack_fffffffffffff888);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e8,(char *)in_stack_fffffffffffff7e0);
        std::runtime_error::runtime_error(this_00,(string *)(local_690 + 0x58));
        local_690[0x37] = 0;
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_400 = local_440;
      std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::operator[]
                ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *)
                 (*local_440 + 0x80),local_518);
      loadQuaternion(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_3b0 = &local_558;
      local_3b8 = &local_618;
      local_558 = local_618;
      pRStack_550 = pRStack_610;
      local_148 = &local_608;
      local_140 = local_548;
      local_158 = &local_5f8;
      local_150 = local_538;
      local_368 = &local_5e8;
      local_360 = local_528;
      local_49d = 1;
      local_310 = local_508;
      local_318 = local_510;
      local_3c0 = (size_t *)((long)local_4f0 + local_510 * 0x40);
      local_3c8 = &local_558;
      *local_3c0 = local_618;
      local_3c0[1] = (size_t)pRStack_610;
      local_108 = local_548;
      local_100 = local_3c0 + 2;
      *local_100 = (size_t)local_608;
      local_3c0[3] = (size_t)pRStack_600;
      local_118 = local_538;
      local_110 = local_3c0 + 4;
      *local_110 = (size_t)local_5f8;
      local_3c0[5] = (size_t)pTStack_5f0;
      local_358 = local_528;
      local_350 = local_3c0 + 6;
      *local_350 = (size_t)local_5e8;
      local_3c0[7] = sStack_5e0;
      local_168 = local_3b8;
      local_160 = local_3b0;
      local_138 = local_3b8;
      local_130 = local_3b0;
      local_128 = local_3c8;
      local_120 = local_3c0;
      local_f8 = local_3c8;
      local_f0 = local_3c0;
    }
    local_510 = local_510 + 1;
    local_518 = local_518 + 1;
  } while( true );
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTransformNode(const Ref<XML>& xml) 
  {
    /* parse number of time steps to use for instanced geometry */
    int time_steps = 1;
    std::string str_time_steps = xml->parm("time_steps");
    if (str_time_steps != "") time_steps = max(1,std::stoi(str_time_steps));

    bool quaternion = false;
    AffineSpace3ff space;
    avector<AffineSpace3ff> spaces(time_steps);
    size_t j = 0;
    for (size_t i=0; i<time_steps; i++) {
      AffineSpace3ff space;
      if (xml->children[i]->name == "AffineSpace") {
        space = (AffineSpace3ff) load<AffineSpace3fa>(xml->children[i]);
        spaces[j++] = space;
      }
      else if (xml->children[i]->name == "Quaternion") {
        space = loadQuaternion(xml->children[i]);
        quaternion = true;
        spaces[j++] = space;
      }
      else {
        THROW_RUNTIME_ERROR(xml->loc.str()+": unknown transformation representation");
      }
    }
    assert(j == time_steps);
    
    if (xml->size() == time_steps+1) {
      auto node = new SceneGraph::TransformNode(spaces,loadNode(xml->children[time_steps]));
      node->spaces.quaternion = quaternion;
      return node;
    }
  
    Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
    for (size_t i=time_steps; i<xml->size(); i++)
      group->add(loadNode(xml->children[i]));
    
    auto node = new  SceneGraph::TransformNode(spaces,group.dynamicCast<SceneGraph::Node>());
    node->spaces.quaternion = quaternion;
    return node;
  }